

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<bool>::reject<QtPromisePrivate::PromiseError_const&>
          (PromiseResolver<bool> *this,PromiseError *error)

{
  QPromise<bool> *pQVar1;
  Data *pDVar2;
  PromiseData<bool> *pPVar3;
  QPromise<bool> *promise;
  PromiseError *error_local;
  PromiseResolver<bool> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<bool> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_>::operator->
                       (&(pQVar1->super_QPromiseBase<bool>).m_d);
    PromiseDataBase<bool,void(bool_const&)>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseDataBase<bool,void(bool_const&)> *)pPVar3,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_>::operator->
                       (&(pQVar1->super_QPromiseBase<bool>).m_d);
    PromiseDataBase<bool,_void_(const_bool_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<bool,_void_(const_bool_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }